

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcArbitraryProfileDefWithVoids::~IfcArbitraryProfileDefWithVoids
          (IfcArbitraryProfileDefWithVoids *this,void **vtt)

{
  void **vtt_local;
  IfcArbitraryProfileDefWithVoids *this_local;
  
  (this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
                  [-3]) = vtt[0xc];
  *(void **)&(this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.field_0x58 = vtt[0xd];
  *(void **)&(this->super_IfcArbitraryClosedProfileDef).field_0x70 = vtt[0xe];
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_1UL,_0UL>::~ListOf
            ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_1UL,_0UL> *)
             &(this->super_IfcArbitraryClosedProfileDef).field_0x80);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcArbitraryProfileDefWithVoids,_1UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcArbitraryProfileDefWithVoids,_1UL> *)
             &(this->super_IfcArbitraryClosedProfileDef).field_0x70,vtt + 10);
  IfcArbitraryClosedProfileDef::~IfcArbitraryClosedProfileDef
            (&this->super_IfcArbitraryClosedProfileDef,vtt + 1);
  return;
}

Assistant:

IfcArbitraryProfileDefWithVoids() : Object("IfcArbitraryProfileDefWithVoids") {}